

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O1

int floatx80_compare_quiet_sparc(floatx80 a,floatx80 b,float_status *status)

{
  ulong uVar1;
  ushort uVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  ushort uVar7;
  
  uVar6 = a.low;
  uVar5 = b.low;
  uVar7 = a.high;
  if ((long)uVar6 < 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)
  {
    uVar2 = b.high;
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 || (long)uVar5 < 0
       ) {
      if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
           (uVar7 & 0x7fff) != 0x7fff) &&
         (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
          (uVar2 & 0x7fff) != 0x7fff)) {
        uVar1 = (a._8_8_ & 0xffff) >> 0xf;
        bVar4 = (byte)uVar1;
        if ((ushort)uVar1 == uVar2 >> 0xf) {
          if (uVar6 == uVar5 && uVar7 == uVar2) {
            return 0;
          }
          bVar4 = (uVar6 < uVar5 && uVar7 == uVar2 || uVar7 < uVar2) ^ bVar4;
        }
        else if (((b._8_4_ | a._8_4_) & 0x7fff) == 0 && (uVar5 == 0 && uVar6 == 0)) {
          return 0;
        }
        iVar3 = 1 - (uint)(byte)(bVar4 * '\x02');
      }
      else if ((((uVar7 & 0x7fff) == 0x7fff) &&
               ((((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) !=
                 (undefined1  [16])0x0 &&
                (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) ==
                 (undefined1  [16])0x0)))) ||
              ((iVar3 = 2, (uVar2 & 0x7fff) == 0x7fff &&
               ((((undefined1  [16])b & (undefined1  [16])0x3fffffffffffffff) !=
                 (undefined1  [16])0x0 &&
                (((undefined1  [16])b & (undefined1  [16])0x4000000000000000) ==
                 (undefined1  [16])0x0)))))) goto LAB_009e76d4;
      return iVar3;
    }
  }
LAB_009e76d4:
  status->float_exception_flags = status->float_exception_flags | 1;
  return 2;
}

Assistant:

static inline bool floatx80_invalid_encoding(floatx80 a)
{
    return (a.low & (1ULL << 63)) == 0 && (a.high & 0x7FFF) != 0;
}